

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackBuilder.cpp
# Opt level: O3

void __thiscall
TrackBuilder::addAmigaSector(TrackBuilder *this,CylHead *cylhead,int sector,void *buf)

{
  pointer puVar1;
  pointer puVar2;
  uint dword;
  TrackBuilder *pTVar3;
  int iVar4;
  uint32_t checksum;
  uint32_t sector_label [4];
  uint32_t local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar4 = 8;
  do {
    addDataBit(this,false);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  addByteWithClock(this,0xa1,10);
  addByteWithClock(this,0xa1,10);
  iVar4 = 0xb;
  if (this->m_datarate == _500K) {
    iVar4 = 0x16;
  }
  local_7c = 0;
  dword = sector << 8 | cylhead->cyl << 0x11 | cylhead->head << 0x10 | iVar4 - sector | 0xff000000;
  pTVar3 = (TrackBuilder *)(ulong)dword;
  addAmigaDword(this,dword,&local_7c);
  local_38 = 0;
  uStack_30 = 0;
  splitAmigaBits(&local_78,pTVar3,&local_38,0x10,&local_7c);
  addAmigaBits(this,&local_78);
  pTVar3 = (TrackBuilder *)(ulong)local_7c;
  addAmigaDword(this,local_7c,&local_7c);
  local_7c = 0;
  splitAmigaBits(&local_58,pTVar3,buf,0x200,&local_7c);
  puVar2 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar1 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  addAmigaDword(this,local_7c,&local_7c);
  addAmigaBits(this,&local_78);
  iVar4 = 8;
  do {
    addDataBit(this,false);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TrackBuilder::addAmigaSector(const CylHead& cylhead, int sector, const void* buf)
{
    addByte(0x00);
    addByteWithClock(0xa1, 0x0a);   // A1 with missing clock bit
    addByteWithClock(0xa1, 0x0a);

    auto sectors = (m_datarate == DataRate::_500K) ? 22 : 11;
    auto remain = sectors - sector;

    uint32_t checksum = 0;
    uint32_t info = (0xff << 24) | (((cylhead.cyl << 1) | cylhead.head) << 16) |
        (sector << 8) | remain;
    addAmigaDword(info, checksum);

    uint32_t sector_label[4] = {};
    auto bits = splitAmigaBits(sector_label, sizeof(sector_label), checksum);
    addAmigaBits(bits);
    addAmigaDword(checksum, checksum);

    checksum = 0;
    bits = splitAmigaBits(buf, 512, checksum);
    addAmigaDword(checksum, checksum);
    addAmigaBits(bits);

    addByte(0x00);
}